

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * __thiscall EXP::forward(EXP *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  int *piVar1;
  double dVar2;
  tensor *ptVar3;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar3 = (tensor *)operator_new(0x20);
  ptVar3->data = 0.0;
  ptVar3->grad = 0.0;
  ptVar3->cnt = 0;
  ptVar3->cnt_free = 0;
  ptVar3->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar3;
  dVar2 = exp((*(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->data);
  ((this->super_node).ret)->data = dVar2;
  dVar2 = exp((*(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->data);
  *(this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = dVar2;
  ptVar3 = *(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  piVar1 = &ptVar3->cnt;
  *piVar1 = *piVar1 + 1;
  piVar1 = &ptVar3->cnt_free;
  *piVar1 = *piVar1 + 1;
  ptVar3 = (this->super_node).ret;
  ptVar3->hook = &this->super_node;
  return ptVar3;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = exp(input[0]->data);
        grad_fn[0] = exp(input[0]->data);
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }